

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleLineEdit::textAtOffset(QAccessibleLineEdit *this)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int *in_R8;
  
  textAtOffset(this,(int)((ulong)in_RSI >> 0x20),(TextBoundaryType)in_RSI,
               (int *)CONCAT44(in_EDX,in_ECX),in_R8);
  return;
}

Assistant:

QString QAccessibleLineEdit::textAtOffset(int offset, QAccessible::TextBoundaryType boundaryType,
        int *startOffset, int *endOffset) const
{
    if (lineEdit()->echoMode() != QLineEdit::Normal) {
        *startOffset = *endOffset = -1;
        return QString();
    }
    if (offset == -2)
        offset = cursorPosition();
    return QAccessibleTextInterface::textAtOffset(offset, boundaryType, startOffset, endOffset);
}